

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O0

int I444ToARGBMatrix(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
                    int src_stride_v,uint8_t *dst_argb,int dst_stride_argb,
                    YuvConstants *yuvconstants,int width,int height)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_YuvConstants_ptr_int *I444ToARGBRow;
  int y;
  uint in_stack_00000020;
  code *pcVar2;
  int local_38;
  uint local_34;
  long local_30;
  uint local_24;
  long local_20;
  uint local_14;
  long local_10;
  int local_4;
  
  pcVar2 = I444ToARGBRow_C;
  if (((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
      ((I444ToARGBRow ==
        (_func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_YuvConstants_ptr_int *)0x0 ||
       ((int)in_stack_00000020 < 1)))) || ((int)src_u == 0)) {
    local_4 = -1;
  }
  else {
    if ((int)src_u < 0) {
      src_u._0_4_ = -(int)src_u;
      I444ToARGBRow = I444ToARGBRow + ((int)src_u + -1) * y;
      y = -y;
    }
    local_34 = in_R9D;
    local_24 = in_ECX;
    local_14 = in_ESI;
    if (((in_ESI == in_stack_00000020) && (in_ECX == in_stack_00000020)) &&
       ((in_R9D == in_stack_00000020 && (y == in_stack_00000020 << 2)))) {
      in_stack_00000020 = (int)src_u * in_stack_00000020;
      src_u._0_4_ = 1;
      y = 0;
      local_34 = 0;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = I444ToARGBRow_Any_SSSE3, (in_stack_00000020 & 7) == 0)) {
      pcVar2 = I444ToARGBRow_SSSE3;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = I444ToARGBRow_Any_AVX2, (in_stack_00000020 & 0xf) == 0)) {
      pcVar2 = I444ToARGBRow_AVX2;
    }
    local_30 = in_R8;
    local_20 = in_RDX;
    local_10 = in_RDI;
    for (local_38 = 0; local_38 < (int)src_u; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_20,local_30,I444ToARGBRow,src_v,in_stack_00000020);
      I444ToARGBRow = I444ToARGBRow + y;
      local_10 = local_10 + (int)local_14;
      local_20 = local_20 + (int)local_24;
      local_30 = local_30 + (int)local_34;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int I444ToARGBMatrix(const uint8_t* src_y,
                     int src_stride_y,
                     const uint8_t* src_u,
                     int src_stride_u,
                     const uint8_t* src_v,
                     int src_stride_v,
                     uint8_t* dst_argb,
                     int dst_stride_argb,
                     const struct YuvConstants* yuvconstants,
                     int width,
                     int height) {
  int y;
  void (*I444ToARGBRow)(const uint8_t* y_buf, const uint8_t* u_buf,
                        const uint8_t* v_buf, uint8_t* rgb_buf,
                        const struct YuvConstants* yuvconstants, int width) =
      I444ToARGBRow_C;
  if (!src_y || !src_u || !src_v || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_y == width && src_stride_u == width && src_stride_v == width &&
      dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_y = src_stride_u = src_stride_v = dst_stride_argb = 0;
  }
#if defined(HAS_I444TOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I444ToARGBRow = I444ToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I444ToARGBRow = I444ToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_I444TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I444ToARGBRow = I444ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I444ToARGBRow = I444ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_I444TOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    I444ToARGBRow = I444ToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      I444ToARGBRow = I444ToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_I444TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I444ToARGBRow = I444ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I444ToARGBRow = I444ToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_I444TOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    I444ToARGBRow = I444ToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      I444ToARGBRow = I444ToARGBRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    I444ToARGBRow(src_y, src_u, src_v, dst_argb, yuvconstants, width);
    dst_argb += dst_stride_argb;
    src_y += src_stride_y;
    src_u += src_stride_u;
    src_v += src_stride_v;
  }
  return 0;
}